

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O0

void duckdb::RightFunction<duckdb::LeftRightGrapheme>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  anon_class_8_1_6971b95b fun;
  reference count;
  Vector *in_RDX;
  DataChunk *in_RDI;
  value_type *pos_vec;
  value_type *str_vec;
  size_type in_stack_ffffffffffffffb8;
  vector<duckdb::Vector,_true> *in_stack_ffffffffffffffc0;
  Vector *result_00;
  reference left;
  
  fun.result = vector<duckdb::Vector,_true>::operator[]
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  count = vector<duckdb::Vector,_true>::operator[]
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  result_00 = in_RDX;
  left = count;
  DataChunk::size(in_RDI);
  BinaryExecutor::
  Execute<duckdb::string_t,long,duckdb::string_t,duckdb::RightFunction<duckdb::LeftRightGrapheme>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,long)_1_>
            (left,in_RDX,result_00,(idx_t)count,fun);
  return;
}

Assistant:

static void RightFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &pos_vec = args.data[1];
	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vec, pos_vec, result, args.size(),
	    [&](string_t str, int64_t pos) { return RightScalarFunction<OP>(result, str, pos); });
}